

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O0

void TT_Done_Context(TT_ExecContext exec)

{
  FT_Memory memory_00;
  FT_Memory memory;
  TT_ExecContext exec_local;
  
  memory_00 = exec->memory;
  exec->maxPoints = 0;
  exec->maxContours = 0;
  ft_mem_free(memory_00,exec->stack);
  exec->stack = (FT_Long *)0x0;
  exec->stackSize = 0;
  ft_mem_free(memory_00,exec->glyfCvt);
  exec->glyfCvt = (FT_Long *)0x0;
  exec->glyfCvtSize = 0;
  ft_mem_free(memory_00,exec->glyfStorage);
  exec->glyfStorage = (FT_Long *)0x0;
  exec->glyfStoreSize = 0;
  ft_mem_free(memory_00,exec->callStack);
  exec->callStack = (TT_CallStack)0x0;
  exec->callSize = 0;
  exec->callTop = 0;
  ft_mem_free(memory_00,exec->glyphIns);
  exec->glyphIns = (FT_Byte *)0x0;
  exec->glyphSize = 0;
  exec->size = (TT_Size)0x0;
  exec->face = (TT_Face)0x0;
  ft_mem_free(memory_00,exec);
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  TT_Done_Context( TT_ExecContext  exec )
  {
    FT_Memory  memory = exec->memory;


    /* points zone */
    exec->maxPoints   = 0;
    exec->maxContours = 0;

    /* free stack */
    FT_FREE( exec->stack );
    exec->stackSize = 0;

    /* free glyf cvt working area */
    FT_FREE( exec->glyfCvt );
    exec->glyfCvtSize = 0;

    /* free glyf storage working area */
    FT_FREE( exec->glyfStorage );
    exec->glyfStoreSize = 0;

    /* free call stack */
    FT_FREE( exec->callStack );
    exec->callSize = 0;
    exec->callTop  = 0;

    /* free glyph code range */
    FT_FREE( exec->glyphIns );
    exec->glyphSize = 0;

    exec->size = NULL;
    exec->face = NULL;

    FT_FREE( exec );
  }